

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::precomputeWordVectors(FastText *this,Matrix *wordVectors)

{
  int32_t iVar1;
  element_type *this_00;
  FastText *in_RSI;
  undefined8 in_RDI;
  real norm;
  string word;
  int32_t i;
  Vector vec;
  undefined4 in_stack_ffffffffffffffa0;
  real in_stack_ffffffffffffffa4;
  Dictionary *in_stack_ffffffffffffffa8;
  Matrix *in_stack_ffffffffffffffb0;
  int64_t in_stack_ffffffffffffffb8;
  Vector *in_stack_ffffffffffffffc0;
  int local_38;
  string *in_stack_ffffffffffffffe0;
  Vector *in_stack_ffffffffffffffe8;
  
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16d17d);
  Vector::Vector(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Matrix::zero((Matrix *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  local_38 = 0;
  while( true ) {
    this_00 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16d1b5);
    iVar1 = Dictionary::nwords(this_00);
    if (iVar1 <= local_38) break;
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x16d1e1);
    Dictionary::getWord_abi_cxx11_(in_stack_ffffffffffffffa8,(int32_t)in_stack_ffffffffffffffa4);
    getWordVector(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    in_stack_ffffffffffffffa4 = Vector::norm((Vector *)in_stack_ffffffffffffffb0);
    if (0.0 < in_stack_ffffffffffffffa4) {
      Matrix::addRow(in_stack_ffffffffffffffb0,(Vector *)in_stack_ffffffffffffffa8,
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (real)((ulong)in_RDI >> 0x20));
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    local_38 = local_38 + 1;
  }
  Vector::~Vector((Vector *)0x16d2b8);
  return;
}

Assistant:

void FastText::precomputeWordVectors(Matrix& wordVectors) {
  Vector vec(args_->dim);
  wordVectors.zero();
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
    getWordVector(vec, word);
    real norm = vec.norm();
    if (norm > 0) {
      wordVectors.addRow(vec, i, 1.0 / norm);
    }
  }
}